

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRImageFromFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  pointer *ppuVar1;
  pointer puVar2;
  int iVar3;
  FILE *__stream;
  ulong __n;
  long *plVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  long *plVar8;
  pointer *ppuVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator<char> local_71;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (exr_image == (EXRImage *)0x0) {
    ppuVar1 = &local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Invalid argument for LoadEXRImageFromFile","");
    puVar2 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (err != (char **)0x0) {
      pcVar6 = strdup((char *)local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      *err = pcVar6;
    }
    if ((pointer *)puVar2 != ppuVar1) {
      operator_delete(puVar2,(ulong)(local_70.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    }
    iVar3 = -3;
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,filename,&local_71);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x2180d6);
      ppuVar1 = &local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      plVar8 = plVar4 + 2;
      if ((pointer *)*plVar4 == (pointer *)plVar8) {
        local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
        lStack_58 = plVar4[3];
        ppuVar9 = ppuVar1;
      }
      else {
        local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
        ppuVar9 = (pointer *)*plVar4;
      }
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar9;
      if (err != (char **)0x0) {
        pcVar6 = strdup((char *)ppuVar9);
        *err = pcVar6;
      }
      if (ppuVar9 != ppuVar1) {
        operator_delete(ppuVar9,(ulong)(local_70.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      iVar3 = -7;
    }
    else {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      if (__n < 0x10) {
        fclose(__stream);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,filename,&local_71);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x2180e8);
        ppuVar1 = &local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        plVar8 = plVar4 + 2;
        if ((pointer *)*plVar4 == (pointer *)plVar8) {
          local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
          lStack_58 = plVar4[3];
          ppuVar9 = ppuVar1;
        }
        else {
          local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
          ppuVar9 = (pointer *)*plVar4;
        }
        local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar4[1];
        *plVar4 = (long)plVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar9;
        if (err != (char **)0x0) {
          pcVar6 = strdup((char *)ppuVar9);
          *err = pcVar6;
        }
        if (ppuVar9 != ppuVar1) {
          operator_delete(ppuVar9,(ulong)(local_70.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        iVar3 = -5;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_70,__n,(allocator_type *)local_50);
        sVar5 = fread(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,1,__n,__stream);
        if (sVar5 != __n) {
          __assert_fail("ret == filesize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                        ,0x2ec6,
                        "int LoadEXRImageFromFile(EXRImage *, const EXRHeader *, const char *, const char **)"
                       );
        }
        fclose(__stream);
        if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar7 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          _Unwind_Resume(uVar7);
        }
        iVar3 = LoadEXRImageFromMemory
                          (exr_image,exr_header,
                           local_70.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,__n,err);
        if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int LoadEXRImageFromFile(EXRImage *exr_image, const EXRHeader *exr_header,
                         const char *filename, const char **err) {
  if (exr_image == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  if (filesize < 16) {
    fclose(fp);
    tinyexr::SetErrorMessage("File size too short " + std::string(filename),
                             err);
    return TINYEXR_ERROR_INVALID_FILE;
  }

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    TEXR_ASSERT(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRImageFromMemory(exr_image, exr_header, &buf.at(0), filesize,
                                err);
}